

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineFiller.cc
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
LineFiller::score_function
          (LineFiller *this,sgNodeID_t n1,sgNodeID_t n2,
          vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *paths)

{
  bool bVar1;
  back_insert_iterator<std::vector<long,_std::allocator<long>_>_> __x;
  reference pPVar2;
  int in_ECX;
  int iVar3;
  int in_EDX;
  vector<long,_std::allocator<long>_> *in_RSI;
  vector<long,_std::allocator<long>_> *in_RDI;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *in_R8;
  PerfectMatch *match_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> *__range2_2;
  long *node;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<long,_std::allocator<long>_> *__range2_1;
  vector<long,_std::allocator<long>_> abs_nodes;
  int32_t score;
  SequenceDistanceGraphPath *path;
  iterator __end1_1;
  iterator __begin1_1;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *__range1_1;
  int pos;
  int32_t max_score_index;
  int32_t max_score;
  PerfectMatch *match;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  long *rid;
  iterator __end1;
  iterator __begin1;
  vector<long,_std::allocator<long>_> *__range1;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> shared_matches;
  vector<long,_std::allocator<long>_> shared_reads;
  value_type reads_n2;
  value_type reads_n1;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> *in_stack_fffffffffffffdd8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffde0;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __last;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __first;
  iterator in_stack_fffffffffffffe30;
  __normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>
  local_198;
  undefined1 *local_190;
  long local_188;
  reference local_180;
  long *local_178;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_170;
  reference local_168;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> local_160;
  int local_144;
  reference local_140;
  SequenceDistanceGraphPath *local_138;
  __normal_iterator<SequenceDistanceGraphPath_*,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>
  local_130 [2];
  int local_11c;
  int local_118;
  int local_114;
  reference local_110;
  PerfectMatch *local_108;
  __normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>
  local_100;
  reference local_f8;
  reference local_f0;
  long *local_e8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_e0;
  undefined1 *local_d8;
  undefined1 local_d0 [24];
  vector<long,_std::allocator<long>_> *local_b8;
  vector<long,_std::allocator<long>_> *local_a8;
  long *local_a0;
  long *local_98;
  long *local_90;
  long *local_88;
  undefined1 local_80 [40];
  long local_58 [3];
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> local_40;
  int local_20;
  
  if (in_EDX < 1) {
    in_EDX = -in_EDX;
  }
  local_20 = in_ECX;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)((in_RSI->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish + 9),(long)in_EDX);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe30._M_current,in_RSI);
  if (local_20 < 1) {
    local_20 = -local_20;
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)((in_RSI->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish + 9),(long)local_20);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe30._M_current,in_RSI);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x509bf3);
  __last._M_current = (long *)&local_40;
  local_88 = (long *)std::vector<long,_std::allocator<long>_>::begin
                               ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
  local_90 = (long *)std::vector<long,_std::allocator<long>_>::end
                               ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
  __first._M_current = local_58;
  local_98 = (long *)std::vector<long,_std::allocator<long>_>::begin
                               ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
  local_a0 = (long *)std::vector<long,_std::allocator<long>_>::end
                               ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
  local_a8 = (vector<long,_std::allocator<long>_> *)
             std::back_inserter<std::vector<long,std::allocator<long>>>
                       ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
  __x = std::
        set_intersection<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::back_insert_iterator<std::vector<long,std::allocator<long>>>,LineFiller::score_function(long,long,std::vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>>)::__0>
                  (local_88,local_90,local_98,local_a0,local_a8);
  local_b8 = (vector<long,_std::allocator<long>_> *)__x;
  std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::vector
            ((vector<PerfectMatch,_std::allocator<PerfectMatch>_> *)0x509cb7);
  local_d8 = local_80;
  local_e0._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
  local_e8 = (long *)std::vector<long,_std::allocator<long>_>::end
                               ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            in_stack_fffffffffffffde0._M_current,
                            (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            in_stack_fffffffffffffdd8), bVar1) {
    local_f0 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator*(&local_e0);
    iVar3 = (int)*local_f0;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    local_f8 = std::
               vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
               ::operator[]((vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                             *)((in_RSI->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                super__Vector_impl_data._M_finish + 3),(long)iVar3);
    local_100._M_current =
         (PerfectMatch *)
         std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::begin(in_stack_fffffffffffffdd8);
    local_108 = (PerfectMatch *)
                std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::end
                          (in_stack_fffffffffffffdd8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>
                               *)in_stack_fffffffffffffde0._M_current,
                              (__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>
                               *)in_stack_fffffffffffffdd8), bVar1) {
      local_110 = __gnu_cxx::
                  __normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>
                  ::operator*(&local_100);
      std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::push_back
                ((vector<PerfectMatch,_std::allocator<PerfectMatch>_> *)__last._M_current,
                 (value_type *)__x.container);
      __gnu_cxx::
      __normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>::
      operator++(&local_100);
    }
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
              (&local_e0);
  }
  local_114 = 0;
  local_118 = 0;
  local_11c = 0;
  local_130[0]._M_current =
       (SequenceDistanceGraphPath *)
       std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::begin
                 ((vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *)
                  in_stack_fffffffffffffdd8);
  local_138 = (SequenceDistanceGraphPath *)
              std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::
              end((vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *)
                  in_stack_fffffffffffffdd8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<SequenceDistanceGraphPath_*,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>
                             *)in_stack_fffffffffffffde0._M_current,
                            (__normal_iterator<SequenceDistanceGraphPath_*,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>
                             *)in_stack_fffffffffffffdd8), bVar1) {
    local_140 = __gnu_cxx::
                __normal_iterator<SequenceDistanceGraphPath_*,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>
                ::operator*(local_130);
    local_144 = 0;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)0x509edd);
    local_168 = local_140;
    local_170._M_current =
         (long *)std::vector<long,_std::allocator<long>_>::begin
                           ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
    local_178 = (long *)std::vector<long,_std::allocator<long>_>::end
                                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_fffffffffffffde0._M_current,
                              (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_fffffffffffffdd8), bVar1) {
      local_180 = __gnu_cxx::
                  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator*(&local_170);
      iVar3 = (int)*local_180;
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      local_188 = (long)iVar3;
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffde0._M_current,
                 (value_type *)in_stack_fffffffffffffdd8);
      __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
      operator++(&local_170);
    }
    local_190 = local_d0;
    local_198._M_current =
         (PerfectMatch *)
         std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::begin(in_stack_fffffffffffffdd8);
    std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::end(in_stack_fffffffffffffdd8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>
                               *)in_stack_fffffffffffffde0._M_current,
                              (__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>
                               *)in_stack_fffffffffffffdd8), bVar1) {
      pPVar2 = __gnu_cxx::
               __normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>
               ::operator*(&local_198);
      in_stack_fffffffffffffdd8 = &local_160;
      std::vector<long,_std::allocator<long>_>::begin
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
      std::vector<long,_std::allocator<long>_>::end
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
      in_stack_fffffffffffffde0 =
           std::find<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,int>
                     (__first,__last,(int *)__x.container);
      in_stack_fffffffffffffe30 =
           std::vector<long,_std::allocator<long>_>::end
                     ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                         in_stack_fffffffffffffde0._M_current,
                         (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                         in_stack_fffffffffffffdd8);
      if (bVar1) {
        local_144 = (uint)pPVar2->size + local_144;
      }
      __gnu_cxx::
      __normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>::
      operator++(&local_198);
    }
    if (local_114 < local_144) {
      local_114 = local_144;
      local_118 = local_11c;
    }
    local_11c = local_11c + 1;
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)__last._M_current);
    __gnu_cxx::
    __normal_iterator<SequenceDistanceGraphPath_*,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>
    ::operator++(local_130);
  }
  std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::operator[]
            (in_R8,(long)local_118);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe30._M_current,in_RSI);
  std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::~vector
            ((vector<PerfectMatch,_std::allocator<PerfectMatch>_> *)__last._M_current);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)__last._M_current);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)__last._M_current);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)__last._M_current);
  return in_RDI;
}

Assistant:

std::vector<sgNodeID_t> LineFiller::score_function(sgNodeID_t n1, sgNodeID_t n2, std::vector<SequenceDistanceGraphPath> paths) {

    // Find all reads spanning both nodes

    auto reads_n1 = lrr.node_reads[abs(n1)];
    auto reads_n2 = lrr.node_reads[abs(n2)];
//    std::cout << "Reads in n1: "<< reads_n1.size()<< " reads in n2: "<< reads_n2.size() << std::endl;

    // Get all matches for both ends of the gap
    std::vector<int64_t> shared_reads;
    std::set_intersection(reads_n1.begin(), reads_n1.end(), reads_n2.begin(), reads_n2.end(),  std::back_inserter(shared_reads), [](int64_t r1, int64_t r2){return abs(r1) < abs(r2);});
//    std::cout << "Shared reads: " << shared_reads.size() << std::endl;

    std::vector<PerfectMatch> shared_matches;
    for (const auto& rid: shared_reads){
        for (const auto& match: lrr.read_perfect_matches[abs(rid)]){
            shared_matches.push_back(match);
        }
    }
//    std::cout << "Shared matches: "<< shared_matches.size() << std::endl;

    int32_t max_score = 0;
    int32_t max_score_index = 0;
    int pos = 0;
    for (const auto& path: paths){
        // Absolute node collection for comparison
        int32_t score = 0;
        std::vector<sgNodeID_t> abs_nodes;
        for (const auto& node: path.nodes){
            abs_nodes.push_back(abs(node));
        }

        for (const auto& match: shared_matches){
            if (std::find(abs_nodes.begin(), abs_nodes.end(), abs(match.node)) != abs_nodes.end()){
                score+=match.size;
            }
        }

        if (score>max_score){
            max_score = score;
            max_score_index = pos;
        }

        pos++;
    }
//    std::cout << "Max score: "<< max_score<< " max position: "<< max_score_index << std::endl;
    return paths[max_score_index].nodes;
}